

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O1

bool __thiscall MeCab::Viterbi::viterbi<false,false>(Viterbi *this,Lattice *lattice)

{
  Tokenizer<mecab_node_t,_mecab_path_t> *pTVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  undefined4 extraout_var_01;
  int extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  mecab_node_t *pmVar8;
  undefined4 extraout_var_05;
  mecab_node_t *pmVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  Connector *in_R8;
  Allocator<mecab_node_t,_mecab_path_t> *in_R9;
  size_t pos_00;
  Node **begin_node_list;
  size_t pos;
  undefined4 extraout_var_00;
  
  iVar4 = (*lattice->_vptr_Lattice[5])(lattice);
  begin_node_list = (Node **)CONCAT44(extraout_var,iVar4);
  iVar4 = (*lattice->_vptr_Lattice[4])(lattice);
  lVar7 = CONCAT44(extraout_var_00,iVar4);
  iVar4 = (*lattice->_vptr_Lattice[0x16])(lattice);
  iVar5 = (*lattice->_vptr_Lattice[0xb])(lattice);
  pos = CONCAT44(extraout_var_02,iVar5);
  iVar5 = (*lattice->_vptr_Lattice[8])(lattice);
  pTVar1 = (this->tokenizer_).ptr_;
  iVar6 = (*lattice->_vptr_Lattice[0x16])(lattice);
  pmVar8 = Tokenizer<mecab_node_t,_mecab_path_t>::getBOSNode
                     (pTVar1,(Allocator<mecab_node_t,_mecab_path_t> *)
                             CONCAT44(extraout_var_04,iVar6));
  iVar6 = (*lattice->_vptr_Lattice[8])(lattice);
  pmVar8->surface = (char *)CONCAT44(extraout_var_05,iVar6);
  *begin_node_list = pmVar8;
  if (pos != 0) {
    pos_00 = 0;
    do {
      if (begin_node_list[pos_00] != (Node *)0x0) {
        in_R8 = (Connector *)lattice;
        pmVar9 = Tokenizer<mecab_node_t,_mecab_path_t>::lookup<false>
                           ((this->tokenizer_).ptr_,
                            (char *)(CONCAT44(extraout_var_03,iVar5) + pos_00),
                            (char *)(CONCAT44(extraout_var_03,iVar5) + pos),
                            (Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_01,iVar4)
                            ,lattice);
        *(mecab_node_t **)(lVar7 + pos_00 * 8) = pmVar9;
        bVar2 = anon_unknown_20::connect<false>
                          (pos_00,pmVar9,begin_node_list,(Node **)(this->connector_).ptr_,in_R8,
                           in_R9);
        if (!bVar2) {
          (*lattice->_vptr_Lattice[0x25])(lattice,"too long sentence.");
          return false;
        }
      }
      pos_00 = pos_00 + 1;
    } while (pos != pos_00);
  }
  pTVar1 = (this->tokenizer_).ptr_;
  iVar4 = (*lattice->_vptr_Lattice[0x16])(lattice);
  pmVar9 = Tokenizer<mecab_node_t,_mecab_path_t>::getEOSNode
                     (pTVar1,(Allocator<mecab_node_t,_mecab_path_t> *)
                             CONCAT44(extraout_var_06,iVar4));
  iVar4 = (*lattice->_vptr_Lattice[8])(lattice);
  iVar5 = (*lattice->_vptr_Lattice[0xb])(lattice);
  pmVar9->surface = (char *)(CONCAT44(extraout_var_08,iVar5) + CONCAT44(extraout_var_07,iVar4));
  iVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
  *(mecab_node_t **)(lVar7 + CONCAT44(extraout_var_09,iVar4) * 8) = pmVar9;
  bVar2 = true;
  if (-1 < extraout_var_02) {
    do {
      if (begin_node_list[pos] != (Node *)0x0) {
        bVar3 = anon_unknown_20::connect<false>
                          (pos,pmVar9,begin_node_list,(Node **)(this->connector_).ptr_,in_R8,in_R9);
        if (!bVar3) {
          (*lattice->_vptr_Lattice[0x25])(lattice,"too long sentence.");
          bVar2 = false;
        }
        break;
      }
      bVar3 = 0 < (long)pos;
      pos = pos - 1;
    } while (bVar3);
  }
  if (bVar2) {
    *begin_node_list = pmVar8;
    iVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
    *(mecab_node_t **)(lVar7 + CONCAT44(extraout_var_10,iVar4) * 8) = pmVar9;
  }
  return bVar2;
}

Assistant:

bool Viterbi::viterbi(Lattice *lattice) const {
  Node **end_node_list   = lattice->end_nodes();
  Node **begin_node_list = lattice->begin_nodes();
  Allocator<Node, Path> *allocator = lattice->allocator();
  const size_t len = lattice->size();
  const char *begin = lattice->sentence();
  const char *end = begin + len;

  Node *bos_node = tokenizer_->getBOSNode(lattice->allocator());
  bos_node->surface = lattice->sentence();
  end_node_list[0] = bos_node;

  for (size_t pos = 0; pos < len; ++pos) {
    if (end_node_list[pos]) {
      Node *right_node = tokenizer_->lookup<IsPartial>(begin + pos, end,
                                                       allocator, lattice);
      begin_node_list[pos] = right_node;
      if (!connect<IsAllPath>(pos, right_node,
                              begin_node_list,
                              end_node_list,
                              connector_.get(),
                              allocator)) {
        lattice->set_what("too long sentence.");
        return false;
      }
}
}

  Node *eos_node = tokenizer_->getEOSNode(lattice->allocator());
  eos_node->surface = lattice->sentence() + lattice->size();
  begin_node_list[lattice->size()] = eos_node;

  for (long pos = len; static_cast<long>(pos) >= 0; --pos) {
    if (end_node_list[pos]) {
      if (!connect<IsAllPath>(pos, eos_node,
                              begin_node_list,
                              end_node_list,
                              connector_.get(),
                              allocator)) {
        lattice->set_what("too long sentence.");
        return false;
      }
      break;
    }
  }

  end_node_list[0] = bos_node;
  begin_node_list[lattice->size()] = eos_node;

  return true;
}